

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  ulong uVar2;
  string *psVar3;
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [52];
  int local_64;
  EasyCollector local_60 [4];
  CURLcode res;
  EasyCollector ecurl;
  int width;
  
  curl::EasyCollector::EasyCollector(local_60);
  local_64 = curl::Easy::perform_url((char *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,0x50,'-',&local_99);
  poVar1 = std::operator<<((ostream *)&std::cout,local_98);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Result       : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_64);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Document size: ");
  curl::EasyCollector::document_abi_cxx11_();
  uVar2 = std::__cxx11::string::size();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Debug size   : ");
  curl::EasyCollector::debug_abi_cxx11_();
  uVar2 = std::__cxx11::string::size();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,0x50,'-',&local_c1);
  poVar1 = std::operator<<((ostream *)&std::cout,local_c0);
  poVar1 = std::operator<<(poVar1,"\n");
  psVar3 = (string *)curl::EasyCollector::document_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,psVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,0x50,'-',&local_e9);
  poVar1 = std::operator<<(poVar1,local_e8);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  curl::EasyCollector::~EasyCollector(local_60);
  return 0;
}

Assistant:

int main() {
    constexpr auto width = 80;
    curl::EasyCollector ecurl; // our curl object

    CURLcode res = ecurl.perform_url("https://lyncon.se/curl-Easy-cpp.txt");

    std::cout
        << std::string(width, '-') << "\n"
        << "Result       : " << res << "\n"
        << "Document size: " << ecurl.document().size() << "\n"
        << "Debug size   : " << ecurl.debug().size() << "\n";

    std::cout
        << std::string(width, '-') << "\n"
        << ecurl.document()                 // print the captured document
        << std::string(width, '-') << "\n";
}